

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::SimpleTimeZone::getOffsetFromLocal
          (SimpleTimeZone *this,UDate date,int32_t nonExistingTimeOpt,int32_t duplicatedTimeOpt,
          int32_t *rawOffsetGMT,int32_t *savingsDST,UErrorCode *status)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  int32_t doy_unused;
  int *local_48;
  int *local_40;
  ulong local_38;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_40 = savingsDST;
  iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[8])();
  *rawOffsetGMT = iVar2;
  local_48 = rawOffsetGMT;
  dVar4 = uprv_floor_63(date / 86400000.0);
  local_38 = (ulong)(uint)(int)(date - dVar4 * 86400000.0);
  Grego::dayToFields(dVar4,&year,&month,&dom,&dow,&doy_unused);
  if (((year & 3U) != 0) ||
     ((iVar2 = 0xc, (year * -0x3d70a3d7 + 0x51eb850U >> 2 | year * 0x40000000) < 0x28f5c29 &&
      (year != (year / 400) * 400)))) {
    iVar2 = 0;
  }
  iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                    (this,1,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)dom,(ulong)(byte)dow,
                     local_38,(ulong)(uint)(int)(char)Grego::MONTH_LENGTH[iVar2 + month],status);
  iVar2 = *local_48;
  *local_40 = iVar3 - iVar2;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar3 - iVar2 < 1) {
      if ((duplicatedTimeOpt & 3U) == 1) {
        return;
      }
      if (((duplicatedTimeOpt & 3U) != 3) && ((duplicatedTimeOpt & 0xcU) != 4)) {
        return;
      }
    }
    else if ((nonExistingTimeOpt & 3U) != 1) {
      if ((nonExistingTimeOpt & 3U) == 3) {
        return;
      }
      if ((~nonExistingTimeOpt & 0xcU) == 0) {
        return;
      }
    }
    iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xd])(this);
    dVar4 = uprv_floor_63((date - (double)iVar2) / 86400000.0);
    Grego::dayToFields(dVar4,&year,&month,&dom,&dow,&doy_unused);
    piVar1 = local_48;
    if (((year & 3U) != 0) ||
       ((iVar3 = 0xc, (year * -0x3d70a3d7 + 0x51eb850U >> 2 | year * 0x40000000) < 0x28f5c29 &&
        (year != (year / 400) * 400)))) {
      iVar3 = 0;
    }
    iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                      (this,1,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)dom,(ulong)(byte)dow
                       ,(ulong)(uint)(int)((date - (double)iVar2) - dVar4 * 86400000.0),
                       (ulong)(uint)(int)(char)Grego::MONTH_LENGTH[iVar3 + month],status);
    *local_40 = iVar2 - *piVar1;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }